

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  uchar uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint x_00;
  stbi_uc *psVar21;
  uchar *data;
  stbi_uc *psVar22;
  ulong uVar23;
  stbi_uc *psVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  uint y_00;
  uchar *puVar28;
  byte *pbVar29;
  uchar *puVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar86;
  int iVar93;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  
  iVar12 = stbi__get16be(s);
  uVar13 = stbi__get16be(s);
  if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (stbi_uc *)0x0;
  }
  iVar12 = stbi__get16be(s);
  if (iVar12 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (stbi_uc *)0x0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar21 = s->img_buffer;
  }
  else {
    psVar21 = s->img_buffer;
    iVar12 = (int)s->img_buffer_end - (int)psVar21;
    if (iVar12 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar12);
      goto LAB_00162b45;
    }
  }
  s->img_buffer = psVar21 + 6;
LAB_00162b45:
  uVar13 = stbi__get16be(s);
  if (uVar13 < 0x11) {
    iVar12 = stbi__get16be(s);
    uVar14 = stbi__get16be(s);
    iVar15 = stbi__get16be(s);
    uVar16 = stbi__get16be(s);
    iVar17 = stbi__get16be(s);
    if ((iVar17 == 8) || (iVar17 == 0x10)) {
      iVar18 = stbi__get16be(s);
      if (iVar18 == 3) {
        iVar18 = stbi__get16be(s);
        uVar19 = stbi__get16be(s);
        stbi__skip(s,iVar18 << 0x10 | uVar19);
        iVar18 = stbi__get16be(s);
        uVar19 = stbi__get16be(s);
        stbi__skip(s,iVar18 << 0x10 | uVar19);
        iVar18 = stbi__get16be(s);
        uVar19 = stbi__get16be(s);
        stbi__skip(s,iVar18 << 0x10 | uVar19);
        uVar19 = stbi__get16be(s);
        if (uVar19 < 2) {
          uVar25 = iVar12 * 0x10000;
          y_00 = uVar25 + uVar14;
          uVar20 = iVar15 * 0x10000;
          x_00 = uVar20 + uVar16;
          iVar12 = y_00 * x_00;
          data = (uchar *)malloc((long)(iVar12 * 4));
          if (data == (uchar *)0x0) {
            stbi__g_failure_reason = "outofmem";
          }
          else {
            if (uVar19 == 0) {
              psVar21 = s->buffer_start;
              psVar1 = s->buffer_start + 1;
              lVar26 = (ulong)((uVar14 | uVar25) * (uVar16 | uVar20)) - 1;
              auVar35._8_4_ = (int)lVar26;
              auVar35._0_8_ = lVar26;
              auVar35._12_4_ = (int)((ulong)lVar26 >> 0x20);
              puVar30 = data + 0x3c;
              uVar19 = (uVar14 + uVar25) * (uVar16 + uVar20);
              uVar23 = 0;
              puVar28 = data;
              auVar31 = _DAT_0018e590;
              do {
                if (uVar23 < uVar13) {
                  if (iVar17 == 0x10) {
                    if (0 < iVar12) {
                      lVar26 = 0;
                      do {
                        iVar15 = stbi__get16be(s);
                        auVar31 = _DAT_0018e590;
                        puVar28[lVar26 * 4] = (uchar)((uint)iVar15 >> 8);
                        lVar26 = lVar26 + 1;
                      } while (uVar19 != (uint)lVar26);
                    }
                  }
                  else if (0 < iVar12) {
                    psVar22 = s->img_buffer;
                    psVar24 = s->img_buffer_end;
                    lVar26 = 0;
                    do {
                      if (psVar22 < psVar24) {
                        s->img_buffer = psVar22 + 1;
                        uVar11 = *psVar22;
                        psVar22 = psVar22 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        uVar11 = '\0';
                      }
                      else {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          uVar11 = '\0';
                          psVar24 = psVar1;
                        }
                        else {
                          uVar11 = *psVar21;
                          psVar24 = psVar21 + iVar15;
                        }
                        auVar31 = _DAT_0018e590;
                        s->img_buffer_end = psVar24;
                        s->img_buffer = psVar1;
                        psVar22 = psVar1;
                      }
                      puVar28[lVar26 * 4] = uVar11;
                      lVar26 = lVar26 + 1;
                    } while (uVar19 != (uint)lVar26);
                  }
                }
                else if (0 < iVar12) {
                  uVar11 = -(uVar23 == 3);
                  uVar27 = 0;
                  do {
                    auVar98._8_4_ = (int)uVar27;
                    auVar98._0_8_ = uVar27;
                    auVar98._12_4_ = (int)(uVar27 >> 0x20);
                    auVar40 = auVar35 ^ auVar31;
                    auVar72 = (auVar98 | _DAT_0018e700) ^ auVar31;
                    iVar15 = auVar40._0_4_;
                    iVar93 = -(uint)(iVar15 < auVar72._0_4_);
                    iVar18 = auVar40._4_4_;
                    auVar53._4_4_ = -(uint)(iVar18 < auVar72._4_4_);
                    iVar38 = auVar40._8_4_;
                    iVar94 = -(uint)(iVar38 < auVar72._8_4_);
                    iVar86 = auVar40._12_4_;
                    auVar53._12_4_ = -(uint)(iVar86 < auVar72._12_4_);
                    auVar60._4_4_ = iVar93;
                    auVar60._0_4_ = iVar93;
                    auVar60._8_4_ = iVar94;
                    auVar60._12_4_ = iVar94;
                    auVar95 = pshuflw(in_XMM5,auVar60,0xe8);
                    auVar55._4_4_ = -(uint)(auVar72._4_4_ == iVar18);
                    auVar55._12_4_ = -(uint)(auVar72._12_4_ == iVar86);
                    auVar55._0_4_ = auVar55._4_4_;
                    auVar55._8_4_ = auVar55._12_4_;
                    auVar102 = pshuflw(in_XMM6,auVar55,0xe8);
                    auVar53._0_4_ = auVar53._4_4_;
                    auVar53._8_4_ = auVar53._12_4_;
                    auVar72 = pshuflw(auVar95,auVar53,0xe8);
                    auVar40._8_4_ = 0xffffffff;
                    auVar40._0_8_ = 0xffffffffffffffff;
                    auVar40._12_4_ = 0xffffffff;
                    auVar40 = (auVar72 | auVar102 & auVar95) ^ auVar40;
                    auVar40 = packssdw(auVar40,auVar40);
                    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0x3c] = uVar11;
                    }
                    auVar53 = auVar55 & auVar60 | auVar53;
                    auVar40 = packssdw(auVar53,auVar53);
                    auVar72._8_4_ = 0xffffffff;
                    auVar72._0_8_ = 0xffffffffffffffff;
                    auVar72._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar72,auVar40 ^ auVar72);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._0_4_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x38] = uVar11;
                    }
                    auVar40 = (auVar98 | _DAT_0018e8a0) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar40._0_4_);
                    auVar90._4_4_ = -(uint)(iVar18 < auVar40._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar40._8_4_);
                    auVar90._12_4_ = -(uint)(iVar86 < auVar40._12_4_);
                    auVar54._4_4_ = iVar93;
                    auVar54._0_4_ = iVar93;
                    auVar54._8_4_ = iVar94;
                    auVar54._12_4_ = iVar94;
                    auVar79._4_4_ = -(uint)(auVar40._4_4_ == iVar18);
                    auVar79._12_4_ = -(uint)(auVar40._12_4_ == iVar86);
                    auVar79._0_4_ = auVar79._4_4_;
                    auVar79._8_4_ = auVar79._12_4_;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar40 = auVar79 & auVar54 | auVar90;
                    auVar40 = packssdw(auVar40,auVar40);
                    auVar3._8_4_ = 0xffffffff;
                    auVar3._0_8_ = 0xffffffffffffffff;
                    auVar3._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar3,auVar40 ^ auVar3);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x34] = uVar11;
                    }
                    auVar72 = pshufhw(auVar54,auVar54,0x84);
                    auVar53 = pshufhw(auVar79,auVar79,0x84);
                    auVar55 = pshufhw(auVar72,auVar90,0x84);
                    auVar56._8_4_ = 0xffffffff;
                    auVar56._0_8_ = 0xffffffffffffffff;
                    auVar56._12_4_ = 0xffffffff;
                    auVar56 = (auVar55 | auVar53 & auVar72) ^ auVar56;
                    auVar72 = packssdw(auVar56,auVar56);
                    auVar72 = packsswb(auVar72,auVar72);
                    if ((auVar72._0_4_ >> 0x18 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x30] = uVar11;
                    }
                    auVar72 = (auVar98 | _DAT_0018e970) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar72._0_4_);
                    auVar58._4_4_ = -(uint)(iVar18 < auVar72._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar72._8_4_);
                    auVar58._12_4_ = -(uint)(iVar86 < auVar72._12_4_);
                    auVar80._4_4_ = iVar93;
                    auVar80._0_4_ = iVar93;
                    auVar80._8_4_ = iVar94;
                    auVar80._12_4_ = iVar94;
                    auVar40 = pshuflw(auVar40,auVar80,0xe8);
                    auVar57._4_4_ = -(uint)(auVar72._4_4_ == iVar18);
                    auVar57._12_4_ = -(uint)(auVar72._12_4_ == iVar86);
                    auVar57._0_4_ = auVar57._4_4_;
                    auVar57._8_4_ = auVar57._12_4_;
                    auVar55 = pshuflw(auVar102 & auVar95,auVar57,0xe8);
                    auVar58._0_4_ = auVar58._4_4_;
                    auVar58._8_4_ = auVar58._12_4_;
                    auVar72 = pshuflw(auVar40,auVar58,0xe8);
                    auVar95._8_4_ = 0xffffffff;
                    auVar95._0_8_ = 0xffffffffffffffff;
                    auVar95._12_4_ = 0xffffffff;
                    auVar95 = (auVar72 | auVar55 & auVar40) ^ auVar95;
                    auVar72 = packssdw(auVar95,auVar95);
                    auVar72 = packsswb(auVar72,auVar72);
                    if ((auVar72 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0x2c] = uVar11;
                    }
                    auVar58 = auVar57 & auVar80 | auVar58;
                    auVar72 = packssdw(auVar58,auVar58);
                    auVar102._8_4_ = 0xffffffff;
                    auVar102._0_8_ = 0xffffffffffffffff;
                    auVar102._12_4_ = 0xffffffff;
                    auVar72 = packssdw(auVar72 ^ auVar102,auVar72 ^ auVar102);
                    auVar72 = packsswb(auVar72,auVar72);
                    if ((auVar72._4_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x28] = uVar11;
                    }
                    auVar72 = (auVar98 | _DAT_0018e960) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar72._0_4_);
                    auVar91._4_4_ = -(uint)(iVar18 < auVar72._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar72._8_4_);
                    auVar91._12_4_ = -(uint)(iVar86 < auVar72._12_4_);
                    auVar59._4_4_ = iVar93;
                    auVar59._0_4_ = iVar93;
                    auVar59._8_4_ = iVar94;
                    auVar59._12_4_ = iVar94;
                    auVar81._4_4_ = -(uint)(auVar72._4_4_ == iVar18);
                    auVar81._12_4_ = -(uint)(auVar72._12_4_ == iVar86);
                    auVar81._0_4_ = auVar81._4_4_;
                    auVar81._8_4_ = auVar81._12_4_;
                    auVar91._0_4_ = auVar91._4_4_;
                    auVar91._8_4_ = auVar91._12_4_;
                    auVar72 = auVar81 & auVar59 | auVar91;
                    auVar72 = packssdw(auVar72,auVar72);
                    auVar4._8_4_ = 0xffffffff;
                    auVar4._0_8_ = 0xffffffffffffffff;
                    auVar4._12_4_ = 0xffffffff;
                    auVar72 = packssdw(auVar72 ^ auVar4,auVar72 ^ auVar4);
                    auVar72 = packsswb(auVar72,auVar72);
                    if ((auVar72 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0x24] = uVar11;
                    }
                    auVar53 = pshufhw(auVar59,auVar59,0x84);
                    auVar95 = pshufhw(auVar81,auVar81,0x84);
                    auVar60 = pshufhw(auVar53,auVar91,0x84);
                    auVar61._8_4_ = 0xffffffff;
                    auVar61._0_8_ = 0xffffffffffffffff;
                    auVar61._12_4_ = 0xffffffff;
                    auVar61 = (auVar60 | auVar95 & auVar53) ^ auVar61;
                    auVar53 = packssdw(auVar61,auVar61);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._6_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x20] = uVar11;
                    }
                    auVar53 = (auVar98 | _DAT_0018e950) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar53._0_4_);
                    auVar63._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar53._8_4_);
                    auVar63._12_4_ = -(uint)(iVar86 < auVar53._12_4_);
                    auVar82._4_4_ = iVar93;
                    auVar82._0_4_ = iVar93;
                    auVar82._8_4_ = iVar94;
                    auVar82._12_4_ = iVar94;
                    auVar72 = pshuflw(auVar72,auVar82,0xe8);
                    auVar62._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar62._12_4_ = -(uint)(auVar53._12_4_ == iVar86);
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar55 = pshuflw(auVar55 & auVar40,auVar62,0xe8);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar40 = pshuflw(auVar72,auVar63,0xe8);
                    auVar96._8_4_ = 0xffffffff;
                    auVar96._0_8_ = 0xffffffffffffffff;
                    auVar96._12_4_ = 0xffffffff;
                    auVar96 = (auVar40 | auVar55 & auVar72) ^ auVar96;
                    auVar40 = packssdw(auVar96,auVar96);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0x1c] = uVar11;
                    }
                    auVar63 = auVar62 & auVar82 | auVar63;
                    auVar40 = packssdw(auVar63,auVar63);
                    auVar5._8_4_ = 0xffffffff;
                    auVar5._0_8_ = 0xffffffffffffffff;
                    auVar5._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar5,auVar40 ^ auVar5);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._8_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x18] = uVar11;
                    }
                    auVar40 = (auVar98 | _DAT_0018e940) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar40._0_4_);
                    auVar92._4_4_ = -(uint)(iVar18 < auVar40._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar40._8_4_);
                    auVar92._12_4_ = -(uint)(iVar86 < auVar40._12_4_);
                    auVar64._4_4_ = iVar93;
                    auVar64._0_4_ = iVar93;
                    auVar64._8_4_ = iVar94;
                    auVar64._12_4_ = iVar94;
                    auVar83._4_4_ = -(uint)(auVar40._4_4_ == iVar18);
                    auVar83._12_4_ = -(uint)(auVar40._12_4_ == iVar86);
                    auVar83._0_4_ = auVar83._4_4_;
                    auVar83._8_4_ = auVar83._12_4_;
                    auVar92._0_4_ = auVar92._4_4_;
                    auVar92._8_4_ = auVar92._12_4_;
                    auVar40 = auVar83 & auVar64 | auVar92;
                    auVar40 = packssdw(auVar40,auVar40);
                    auVar6._8_4_ = 0xffffffff;
                    auVar6._0_8_ = 0xffffffffffffffff;
                    auVar6._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0x14] = uVar11;
                    }
                    auVar53 = pshufhw(auVar64,auVar64,0x84);
                    auVar95 = pshufhw(auVar83,auVar83,0x84);
                    auVar60 = pshufhw(auVar53,auVar92,0x84);
                    auVar65._8_4_ = 0xffffffff;
                    auVar65._0_8_ = 0xffffffffffffffff;
                    auVar65._12_4_ = 0xffffffff;
                    auVar65 = (auVar60 | auVar95 & auVar53) ^ auVar65;
                    auVar53 = packssdw(auVar65,auVar65);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._10_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -0x10] = uVar11;
                    }
                    auVar53 = (auVar98 | _DAT_0018e930) ^ auVar31;
                    iVar93 = -(uint)(iVar15 < auVar53._0_4_);
                    auVar67._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    iVar94 = -(uint)(iVar38 < auVar53._8_4_);
                    auVar67._12_4_ = -(uint)(iVar86 < auVar53._12_4_);
                    auVar84._4_4_ = iVar93;
                    auVar84._0_4_ = iVar93;
                    auVar84._8_4_ = iVar94;
                    auVar84._12_4_ = iVar94;
                    auVar40 = pshuflw(auVar40,auVar84,0xe8);
                    auVar66._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar66._12_4_ = -(uint)(auVar53._12_4_ == iVar86);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    in_XMM6 = pshuflw(auVar55 & auVar72,auVar66,0xe8);
                    in_XMM6 = in_XMM6 & auVar40;
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar40 = pshuflw(auVar40,auVar67,0xe8);
                    auVar97._8_4_ = 0xffffffff;
                    auVar97._0_8_ = 0xffffffffffffffff;
                    auVar97._12_4_ = 0xffffffff;
                    auVar97 = (auVar40 | in_XMM6) ^ auVar97;
                    auVar40 = packssdw(auVar97,auVar97);
                    in_XMM5 = packsswb(auVar40,auVar40);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -0xc] = uVar11;
                    }
                    auVar67 = auVar66 & auVar84 | auVar67;
                    auVar40 = packssdw(auVar67,auVar67);
                    auVar7._8_4_ = 0xffffffff;
                    auVar7._0_8_ = 0xffffffffffffffff;
                    auVar7._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar7,auVar40 ^ auVar7);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._12_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4 + -8] = uVar11;
                    }
                    auVar40 = (auVar98 | _DAT_0018e920) ^ auVar31;
                    auVar85._0_4_ = -(uint)(iVar15 < auVar40._0_4_);
                    auVar85._4_4_ = -(uint)(iVar18 < auVar40._4_4_);
                    auVar85._8_4_ = -(uint)(iVar38 < auVar40._8_4_);
                    auVar85._12_4_ = -(uint)(iVar86 < auVar40._12_4_);
                    auVar68._4_4_ = auVar85._0_4_;
                    auVar68._0_4_ = auVar85._0_4_;
                    auVar68._8_4_ = auVar85._8_4_;
                    auVar68._12_4_ = auVar85._8_4_;
                    auVar34._4_4_ = -(uint)(auVar40._4_4_ == iVar18);
                    auVar34._12_4_ = -(uint)(auVar40._12_4_ == iVar86);
                    auVar34._0_4_ = auVar34._4_4_;
                    auVar34._8_4_ = auVar34._12_4_;
                    auVar37._4_4_ = auVar85._4_4_;
                    auVar37._0_4_ = auVar85._4_4_;
                    auVar37._8_4_ = auVar85._12_4_;
                    auVar37._12_4_ = auVar85._12_4_;
                    auVar40 = packssdw(auVar85,auVar34 & auVar68 | auVar37);
                    auVar8._8_4_ = 0xffffffff;
                    auVar8._0_8_ = 0xffffffffffffffff;
                    auVar8._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 ^ auVar8,auVar40 ^ auVar8);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar30[uVar27 * 4 + -4] = uVar11;
                    }
                    auVar72 = pshufhw(auVar68,auVar68,0x84);
                    auVar40 = pshufhw(auVar34,auVar34,0x84);
                    auVar98 = pshufhw(auVar37,auVar37,0x84);
                    auVar9._8_4_ = 0xffffffff;
                    auVar9._0_8_ = 0xffffffffffffffff;
                    auVar9._12_4_ = 0xffffffff;
                    auVar40 = packssdw(auVar40 & auVar72,(auVar98 | auVar40 & auVar72) ^ auVar9);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._14_2_ >> 8 & 1) != 0) {
                      puVar30[uVar27 * 4] = uVar11;
                    }
                    uVar27 = uVar27 + 0x10;
                  } while (((ulong)uVar19 + 0xf & 0xfffffffffffffff0) != uVar27);
                }
                uVar23 = uVar23 + 1;
                puVar30 = puVar30 + 1;
                puVar28 = puVar28 + 1;
              } while (uVar23 != 4);
            }
            else {
              stbi__skip(s,uVar13 * y_00 * 2);
              psVar21 = s->buffer_start;
              psVar1 = s->buffer_start + 1;
              lVar26 = (ulong)((uVar14 | uVar25) * (uVar16 | uVar20)) - 1;
              auVar31._8_4_ = (int)lVar26;
              auVar31._0_8_ = lVar26;
              auVar31._12_4_ = (int)((ulong)lVar26 >> 0x20);
              puVar28 = data + 0x3c;
              uVar23 = 0;
              do {
                if (uVar23 < uVar13) {
                  if (0 < iVar12) {
                    pbVar29 = data + uVar23;
                    iVar15 = 0;
                    do {
                      pbVar2 = s->img_buffer;
                      psVar22 = s->img_buffer_end;
                      if (pbVar2 < psVar22) {
                        s->img_buffer = pbVar2 + 1;
                        bVar10 = *pbVar2;
                        psVar24 = pbVar2 + 1;
LAB_00162e15:
                        if (bVar10 != 0x80) {
                          uVar19 = (uint)bVar10;
                          if (-1 < (char)bVar10) goto LAB_00162e2f;
                          if (psVar24 < psVar22) {
                            s->img_buffer = psVar24 + 1;
                            bVar10 = *psVar24;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar10 = 0;
                          }
                          else {
                            iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                            if (iVar17 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar10 = 0;
                              psVar22 = psVar1;
                            }
                            else {
                              bVar10 = *psVar21;
                              psVar22 = psVar21 + iVar17;
                            }
                            s->img_buffer_end = psVar22;
                            s->img_buffer = psVar1;
                          }
                          iVar17 = uVar19 - 0x101;
                          do {
                            *pbVar29 = bVar10;
                            pbVar29 = pbVar29 + 4;
                            iVar17 = iVar17 + 1;
                          } while (iVar17 != 0);
                          iVar15 = iVar15 + (0x101 - uVar19);
                        }
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                          if (iVar17 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar10 = 0;
                            psVar22 = psVar1;
                          }
                          else {
                            bVar10 = *psVar21;
                            psVar22 = psVar21 + iVar17;
                          }
                          s->img_buffer_end = psVar22;
                          s->img_buffer = psVar1;
                          psVar24 = psVar1;
                          goto LAB_00162e15;
                        }
                        uVar19 = 0;
LAB_00162e2f:
                        iVar17 = uVar19 + 1;
                        do {
                          pbVar2 = s->img_buffer;
                          if (pbVar2 < s->img_buffer_end) {
                            s->img_buffer = pbVar2 + 1;
                            bVar10 = *pbVar2;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar10 = 0;
                          }
                          else {
                            iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                            if (iVar18 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar10 = 0;
                              psVar22 = psVar1;
                            }
                            else {
                              bVar10 = *psVar21;
                              psVar22 = psVar21 + iVar18;
                            }
                            s->img_buffer_end = psVar22;
                            s->img_buffer = psVar1;
                          }
                          *pbVar29 = bVar10;
                          pbVar29 = pbVar29 + 4;
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                        iVar15 = iVar15 + uVar19 + 1;
                      }
                    } while (iVar15 < iVar12);
                  }
                }
                else if (0 < iVar12) {
                  uVar11 = -(uVar23 == 3);
                  uVar27 = 0;
                  do {
                    auVar32._8_4_ = (int)uVar27;
                    auVar32._0_8_ = uVar27;
                    auVar32._12_4_ = (int)(uVar27 >> 0x20);
                    auVar35 = auVar31 ^ _DAT_0018e590;
                    auVar40 = (auVar32 | _DAT_0018e700) ^ _DAT_0018e590;
                    iVar15 = auVar35._0_4_;
                    iVar86 = -(uint)(iVar15 < auVar40._0_4_);
                    iVar17 = auVar35._4_4_;
                    auVar42._4_4_ = -(uint)(iVar17 < auVar40._4_4_);
                    iVar18 = auVar35._8_4_;
                    iVar93 = -(uint)(iVar18 < auVar40._8_4_);
                    iVar38 = auVar35._12_4_;
                    auVar42._12_4_ = -(uint)(iVar38 < auVar40._12_4_);
                    auVar70._4_4_ = iVar86;
                    auVar70._0_4_ = iVar86;
                    auVar70._8_4_ = iVar93;
                    auVar70._12_4_ = iVar93;
                    auVar35 = pshuflw(in_XMM5,auVar70,0xe8);
                    auVar41._4_4_ = -(uint)(auVar40._4_4_ == iVar17);
                    auVar41._12_4_ = -(uint)(auVar40._12_4_ == iVar38);
                    auVar41._0_4_ = auVar41._4_4_;
                    auVar41._8_4_ = auVar41._12_4_;
                    auVar98 = pshuflw(in_XMM6,auVar41,0xe8);
                    auVar42._0_4_ = auVar42._4_4_;
                    auVar42._8_4_ = auVar42._12_4_;
                    auVar40 = pshuflw(auVar35,auVar42,0xe8);
                    auVar99._8_4_ = 0xffffffff;
                    auVar99._0_8_ = 0xffffffffffffffff;
                    auVar99._12_4_ = 0xffffffff;
                    auVar35 = (auVar40 | auVar98 & auVar35) ^ auVar99;
                    auVar35 = packssdw(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0x3c] = uVar11;
                    }
                    auVar42 = auVar41 & auVar70 | auVar42;
                    auVar35 = packssdw(auVar42,auVar42);
                    auVar35 = packssdw(auVar35 ^ auVar99,auVar35 ^ auVar99);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._0_4_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x38] = uVar11;
                    }
                    auVar35 = (auVar32 | _DAT_0018e8a0) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar35._0_4_);
                    auVar87._4_4_ = -(uint)(iVar17 < auVar35._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar35._8_4_);
                    auVar87._12_4_ = -(uint)(iVar38 < auVar35._12_4_);
                    auVar43._4_4_ = iVar86;
                    auVar43._0_4_ = iVar86;
                    auVar43._8_4_ = iVar93;
                    auVar43._12_4_ = iVar93;
                    auVar71._4_4_ = -(uint)(auVar35._4_4_ == iVar17);
                    auVar71._12_4_ = -(uint)(auVar35._12_4_ == iVar38);
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar35 = auVar71 & auVar43 | auVar87;
                    auVar35 = packssdw(auVar35,auVar35);
                    auVar35 = packssdw(auVar35 ^ auVar99,auVar35 ^ auVar99);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x34] = uVar11;
                    }
                    auVar40 = pshufhw(auVar43,auVar43,0x84);
                    auVar72 = pshufhw(auVar71,auVar71,0x84);
                    auVar98 = pshufhw(auVar40,auVar87,0x84);
                    auVar40 = (auVar98 | auVar72 & auVar40) ^ auVar99;
                    auVar40 = packssdw(auVar40,auVar40);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x30] = uVar11;
                    }
                    auVar40 = (auVar32 | _DAT_0018e970) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar40._0_4_);
                    auVar45._4_4_ = -(uint)(iVar17 < auVar40._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar40._8_4_);
                    auVar45._12_4_ = -(uint)(iVar38 < auVar40._12_4_);
                    auVar73._4_4_ = iVar86;
                    auVar73._0_4_ = iVar86;
                    auVar73._8_4_ = iVar93;
                    auVar73._12_4_ = iVar93;
                    auVar35 = pshuflw(auVar35,auVar73,0xe8);
                    auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar17);
                    auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar38);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar98 = pshuflw(auVar99,auVar44,0xe8);
                    auVar45._0_4_ = auVar45._4_4_;
                    auVar45._8_4_ = auVar45._12_4_;
                    auVar40 = pshuflw(auVar35,auVar45,0xe8);
                    auVar100._8_4_ = 0xffffffff;
                    auVar100._0_8_ = 0xffffffffffffffff;
                    auVar100._12_4_ = 0xffffffff;
                    auVar35 = (auVar40 | auVar98 & auVar35) ^ auVar100;
                    auVar35 = packssdw(auVar35,auVar35);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0x2c] = uVar11;
                    }
                    auVar45 = auVar44 & auVar73 | auVar45;
                    auVar35 = packssdw(auVar45,auVar45);
                    auVar35 = packssdw(auVar35 ^ auVar100,auVar35 ^ auVar100);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._4_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x28] = uVar11;
                    }
                    auVar35 = (auVar32 | _DAT_0018e960) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar35._0_4_);
                    auVar88._4_4_ = -(uint)(iVar17 < auVar35._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar35._8_4_);
                    auVar88._12_4_ = -(uint)(iVar38 < auVar35._12_4_);
                    auVar46._4_4_ = iVar86;
                    auVar46._0_4_ = iVar86;
                    auVar46._8_4_ = iVar93;
                    auVar46._12_4_ = iVar93;
                    auVar74._4_4_ = -(uint)(auVar35._4_4_ == iVar17);
                    auVar74._12_4_ = -(uint)(auVar35._12_4_ == iVar38);
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    auVar35 = auVar74 & auVar46 | auVar88;
                    auVar35 = packssdw(auVar35,auVar35);
                    auVar35 = packssdw(auVar35 ^ auVar100,auVar35 ^ auVar100);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0x24] = uVar11;
                    }
                    auVar40 = pshufhw(auVar46,auVar46,0x84);
                    auVar72 = pshufhw(auVar74,auVar74,0x84);
                    auVar98 = pshufhw(auVar40,auVar88,0x84);
                    auVar40 = (auVar98 | auVar72 & auVar40) ^ auVar100;
                    auVar40 = packssdw(auVar40,auVar40);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._6_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x20] = uVar11;
                    }
                    auVar40 = (auVar32 | _DAT_0018e950) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar40._0_4_);
                    auVar48._4_4_ = -(uint)(iVar17 < auVar40._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar40._8_4_);
                    auVar48._12_4_ = -(uint)(iVar38 < auVar40._12_4_);
                    auVar75._4_4_ = iVar86;
                    auVar75._0_4_ = iVar86;
                    auVar75._8_4_ = iVar93;
                    auVar75._12_4_ = iVar93;
                    auVar35 = pshuflw(auVar35,auVar75,0xe8);
                    auVar47._4_4_ = -(uint)(auVar40._4_4_ == iVar17);
                    auVar47._12_4_ = -(uint)(auVar40._12_4_ == iVar38);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar98 = pshuflw(auVar100,auVar47,0xe8);
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    auVar40 = pshuflw(auVar35,auVar48,0xe8);
                    auVar101._8_4_ = 0xffffffff;
                    auVar101._0_8_ = 0xffffffffffffffff;
                    auVar101._12_4_ = 0xffffffff;
                    auVar35 = (auVar40 | auVar98 & auVar35) ^ auVar101;
                    auVar35 = packssdw(auVar35,auVar35);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0x1c] = uVar11;
                    }
                    auVar48 = auVar47 & auVar75 | auVar48;
                    auVar35 = packssdw(auVar48,auVar48);
                    auVar35 = packssdw(auVar35 ^ auVar101,auVar35 ^ auVar101);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._8_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x18] = uVar11;
                    }
                    auVar35 = (auVar32 | _DAT_0018e940) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar35._0_4_);
                    auVar89._4_4_ = -(uint)(iVar17 < auVar35._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar35._8_4_);
                    auVar89._12_4_ = -(uint)(iVar38 < auVar35._12_4_);
                    auVar49._4_4_ = iVar86;
                    auVar49._0_4_ = iVar86;
                    auVar49._8_4_ = iVar93;
                    auVar49._12_4_ = iVar93;
                    auVar76._4_4_ = -(uint)(auVar35._4_4_ == iVar17);
                    auVar76._12_4_ = -(uint)(auVar35._12_4_ == iVar38);
                    auVar76._0_4_ = auVar76._4_4_;
                    auVar76._8_4_ = auVar76._12_4_;
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    auVar35 = auVar76 & auVar49 | auVar89;
                    auVar35 = packssdw(auVar35,auVar35);
                    auVar35 = packssdw(auVar35 ^ auVar101,auVar35 ^ auVar101);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0x14] = uVar11;
                    }
                    auVar40 = pshufhw(auVar49,auVar49,0x84);
                    auVar72 = pshufhw(auVar76,auVar76,0x84);
                    auVar98 = pshufhw(auVar40,auVar89,0x84);
                    auVar40 = (auVar98 | auVar72 & auVar40) ^ auVar101;
                    auVar40 = packssdw(auVar40,auVar40);
                    auVar40 = packsswb(auVar40,auVar40);
                    if ((auVar40._10_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -0x10] = uVar11;
                    }
                    auVar40 = (auVar32 | _DAT_0018e930) ^ _DAT_0018e590;
                    iVar86 = -(uint)(iVar15 < auVar40._0_4_);
                    auVar51._4_4_ = -(uint)(iVar17 < auVar40._4_4_);
                    iVar93 = -(uint)(iVar18 < auVar40._8_4_);
                    auVar51._12_4_ = -(uint)(iVar38 < auVar40._12_4_);
                    auVar77._4_4_ = iVar86;
                    auVar77._0_4_ = iVar86;
                    auVar77._8_4_ = iVar93;
                    auVar77._12_4_ = iVar93;
                    auVar35 = pshuflw(auVar35,auVar77,0xe8);
                    auVar50._4_4_ = -(uint)(auVar40._4_4_ == iVar17);
                    auVar50._12_4_ = -(uint)(auVar40._12_4_ == iVar38);
                    auVar50._0_4_ = auVar50._4_4_;
                    auVar50._8_4_ = auVar50._12_4_;
                    auVar98 = pshuflw(auVar101,auVar50,0xe8);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    auVar40 = pshuflw(auVar35,auVar51,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar35 = (auVar40 | auVar98 & auVar35) ^ in_XMM6;
                    auVar35 = packssdw(auVar35,auVar35);
                    in_XMM5 = packsswb(auVar35,auVar35);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -0xc] = uVar11;
                    }
                    auVar51 = auVar50 & auVar77 | auVar51;
                    auVar35 = packssdw(auVar51,auVar51);
                    auVar35 = packssdw(auVar35 ^ in_XMM6,auVar35 ^ in_XMM6);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._12_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4 + -8] = uVar11;
                    }
                    auVar35 = (auVar32 | _DAT_0018e920) ^ _DAT_0018e590;
                    auVar78._0_4_ = -(uint)(iVar15 < auVar35._0_4_);
                    auVar78._4_4_ = -(uint)(iVar17 < auVar35._4_4_);
                    auVar78._8_4_ = -(uint)(iVar18 < auVar35._8_4_);
                    auVar78._12_4_ = -(uint)(iVar38 < auVar35._12_4_);
                    auVar52._4_4_ = auVar78._0_4_;
                    auVar52._0_4_ = auVar78._0_4_;
                    auVar52._8_4_ = auVar78._8_4_;
                    auVar52._12_4_ = auVar78._8_4_;
                    auVar33._4_4_ = -(uint)(auVar35._4_4_ == iVar17);
                    auVar33._12_4_ = -(uint)(auVar35._12_4_ == iVar38);
                    auVar33._0_4_ = auVar33._4_4_;
                    auVar33._8_4_ = auVar33._12_4_;
                    auVar36._4_4_ = auVar78._4_4_;
                    auVar36._0_4_ = auVar78._4_4_;
                    auVar36._8_4_ = auVar78._12_4_;
                    auVar36._12_4_ = auVar78._12_4_;
                    auVar35 = packssdw(auVar78,auVar33 & auVar52 | auVar36);
                    auVar35 = packssdw(auVar35 ^ in_XMM6,auVar35 ^ in_XMM6);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar28[uVar27 * 4 + -4] = uVar11;
                    }
                    auVar98 = pshufhw(auVar52,auVar52,0x84);
                    auVar35 = pshufhw(auVar33,auVar33,0x84);
                    auVar40 = pshufhw(auVar36,auVar36,0x84);
                    auVar35 = packssdw(auVar35 & auVar98,(auVar40 | auVar35 & auVar98) ^ in_XMM6);
                    auVar35 = packsswb(auVar35,auVar35);
                    if ((auVar35._14_2_ >> 8 & 1) != 0) {
                      puVar28[uVar27 * 4] = uVar11;
                    }
                    uVar27 = uVar27 + 0x10;
                  } while (((ulong)((uVar14 + uVar25) * (uVar16 + uVar20)) + 0xf &
                           0xfffffffffffffff0) != uVar27);
                }
                uVar23 = uVar23 + 1;
                puVar28 = puVar28 + 1;
              } while (uVar23 != 4);
            }
            if ((3 < uVar13) && (0 < iVar12)) {
              uVar23 = 0;
              do {
                bVar10 = data[uVar23 * 4 + 3];
                if ((bVar10 != 0) && (bVar10 != 0xff)) {
                  fVar69 = 1.0 / ((float)bVar10 / 255.0);
                  fVar39 = (1.0 - fVar69) * 255.0;
                  data[uVar23 * 4] = (uchar)(int)((float)data[uVar23 * 4] * fVar69 + fVar39);
                  data[uVar23 * 4 + 1] = (uchar)(int)((float)data[uVar23 * 4 + 1] * fVar69 + fVar39)
                  ;
                  data[uVar23 * 4 + 2] = (uchar)(int)((float)data[uVar23 * 4 + 2] * fVar69 + fVar39)
                  ;
                }
                uVar23 = uVar23 + 1;
              } while ((uVar14 + uVar25) * (uVar16 + uVar20) != uVar23);
            }
            if (((req_comp & 0xfffffffbU) == 0) ||
               (data = stbi__convert_format(data,4,req_comp,x_00,y_00), data != (uchar *)0x0)) {
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int bitdepth;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            stbi_uc val = channel == 3 ? 255 : 0;
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = val;
         } else {
            // Read the data.
            if (bitdepth == 16) {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = (stbi_uc) (stbi__get16be(s) >> 8);
            } else {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = stbi__get8(s);
            }
         }
      }
   }

   if (channelCount >= 4) {
      for (i=0; i < w*h; ++i) {
         unsigned char *pixel = out + 4*i;
         if (pixel[3] != 0 && pixel[3] != 255) {
            // remove weird white matte from PSD
            float a = pixel[3] / 255.0f;
            float ra = 1.0f / a;
            float inv_a = 255.0f * (1 - ra);
            pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
            pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
            pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}